

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_lc_blyp.c
# Opt level: O0

void set_ext_params(xc_func_type *p,double *ext_params)

{
  double *in_RSI;
  xc_func_type *in_RDI;
  double dVar1;
  double cx;
  
  dVar1 = get_ext_param(in_RDI,in_RSI,0);
  *in_RDI->mix_coef = 1.0 - dVar1;
  in_RDI->cam_alpha = dVar1;
  return;
}

Assistant:

static void
set_ext_params(xc_func_type *p, const double *ext_params)
{
  double omega;

  assert(p != NULL);
  omega  = get_ext_param(p, ext_params, 0);
  xc_func_set_ext_params_name(p->func_aux[0], "_omega", omega);

  p->cam_alpha = 1.0;
  p->cam_beta = -1.0;
  p->cam_omega = omega;
}